

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void print_out(string *_str,int _x,int _y)

{
  WINDOW *pWVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  ulong uVar6;
  undefined8 uVar7;
  int local_60;
  ulong local_50;
  size_t i;
  int y;
  int line_n;
  size_t total_cols;
  size_t total_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  int _y_local;
  int _x_local;
  string *_str_local;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = _y;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = _x;
  vera::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&total_lines,_str,'\n',false);
  if (out_win == (WINDOW *)0x0) {
    local_60 = -1;
  }
  else {
    local_60 = out_win->_maxy + 1;
  }
  uVar4 = (long)local_60 - 2;
  i._4_4_ = 0;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&total_lines);
  if (uVar4 < sVar5) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&total_lines);
    i._4_4_ = (int)sVar5 - (int)uVar4;
  }
  if (out_offset_line < 0) {
    out_offset_line = 0;
  }
  uVar6 = (ulong)out_offset_line;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&total_lines);
  if (sVar5 - uVar4 <= uVar6) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&total_lines);
    out_offset_line = (int)sVar5 - (int)uVar4;
  }
  i._4_4_ = i._4_4_ - out_offset_line;
  if (i._4_4_ < 0) {
    i._4_4_ = 0;
  }
  i._0_4_ = 0;
  for (local_50 = (ulong)i._4_4_;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&total_lines),
      iVar2 = lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_, pWVar1 = out_win,
      local_50 < sVar5; local_50 = local_50 + 1) {
    if ((ulong)(long)(int)i < uVar4) {
      iVar3 = (int)lines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + (int)i;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&total_lines,local_50);
      uVar7 = std::__cxx11::string::c_str();
      mvwprintw(pWVar1,iVar3,iVar2,"%s",uVar7);
      i._0_4_ = (int)i + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&total_lines);
  return;
}

Assistant:

void print_out(const std::string& _str, int _x, int _y) {
    std::vector<std::string> lines = vera::split(_str, '\n');
    size_t total_lines, total_cols;
    getmaxyx(out_win, total_lines, total_cols);
    total_lines -= 2;

    int line_n = 0;

    if (lines.size() > total_lines)
        line_n = lines.size() - total_lines;
    
    if (out_offset_line < 0)
        out_offset_line = 0;

    if (out_offset_line >= lines.size()-total_lines)
        out_offset_line = lines.size()-total_lines;

    line_n -= out_offset_line;
    if (line_n < 0)
        line_n = 0;

    int y = 0;
    for (size_t i = line_n; i < lines.size(); i++) {
        if (y < total_lines)
            mvwprintw(out_win, _y + y++, _x, "%s", lines[i].c_str() );
    }
}